

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O0

void __thiscall
duckdb::IEJoinGlobalSourceState::GetNextPair
          (IEJoinGlobalSourceState *this,ClientContext *client,IEJoinLocalSourceState *lstate)

{
  idx_t iVar1;
  idx_t iVar2;
  unsigned_long *args_5;
  unsigned_long *puVar3;
  reference pvVar4;
  __int_type _Var5;
  __int_type _Var6;
  __int_type _Var7;
  pointer pbVar8;
  __atomic_base<unsigned_long> *this_00;
  __atomic_base<unsigned_long> *p_Var9;
  long in_RDX;
  __uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> args;
  long in_RDI;
  __int_type r;
  __int_type l;
  unsigned_long b2;
  unsigned_long b1;
  __int_type i;
  idx_t pair_count;
  idx_t right_blocks;
  idx_t left_blocks;
  GlobalSortedTable *right_table;
  GlobalSortedTable *left_table;
  GlobalSortedTable *in_stack_ffffffffffffff58;
  unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true> *puVar10;
  GlobalSortedTable *in_stack_ffffffffffffff60;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff68;
  GlobalSortedTable *in_stack_ffffffffffffff88;
  __atomic_base<unsigned_long> *p_Var11;
  unsigned_long *in_stack_ffffffffffffff90;
  GlobalSortedTable *in_stack_ffffffffffffff98;
  PhysicalIEJoin *in_stack_ffffffffffffffa0;
  
  vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                *)in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
  unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
  ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
               *)in_stack_ffffffffffffff60);
  vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                *)in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
  unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
  ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
               *)in_stack_ffffffffffffff60);
  iVar1 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(in_stack_ffffffffffffff58);
  iVar2 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(in_stack_ffffffffffffff58);
  args_5 = (unsigned_long *)(iVar1 * iVar2);
  puVar3 = (unsigned_long *)
           ::std::__atomic_base<unsigned_long>::operator++
                     ((__atomic_base<unsigned_long> *)(in_RDI + 0x68),0);
  if (puVar3 < args_5) {
    args._M_t.
    super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
    super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl =
         (tuple<duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>)
         ((ulong)puVar3 % iVar2);
    *(ulong *)(in_RDX + 0x20) = (ulong)puVar3 / iVar2;
    pvVar4 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff60,
                        (size_type)in_stack_ffffffffffffff58);
    *(value_type *)(in_RDX + 0x18) = *pvVar4;
    ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
    (in_RDX + 0x30))->_M_t =
         args._M_t.
         super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
         super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl;
    pvVar4 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff60,
                        (size_type)in_stack_ffffffffffffff58);
    *(value_type *)(in_RDX + 0x28) = *pvVar4;
    puVar10 = (unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true> *)
              &stack0xffffffffffffffa8;
    make_uniq<duckdb::IEJoinUnion,duckdb::ClientContext&,duckdb::PhysicalIEJoin_const&,duckdb::PhysicalRangeJoin::GlobalSortedTable&,unsigned_long_const&,duckdb::PhysicalRangeJoin::GlobalSortedTable&,unsigned_long_const&>
              ((ClientContext *)
               args._M_t.
               super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>
               .super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,args_5);
    unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::operator=
              ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true> *)
               in_stack_ffffffffffffff60,puVar10);
    unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::~unique_ptr
              ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true> *)
               0x181d8bb);
  }
  else {
    _Var5 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68);
    if ((_Var5 != 0) ||
       (_Var5 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68),
       _Var5 != 0)) {
      while (puVar3 = (unsigned_long *)
                      ::std::__atomic_base::operator_cast_to_unsigned_long
                                (in_stack_ffffffffffffff68), puVar3 < args_5) {
        ::std::this_thread::yield();
      }
      _Var6 = ::std::__atomic_base<unsigned_long>::operator++
                        ((__atomic_base<unsigned_long> *)(in_RDI + 0xb0),0);
      _Var5 = _Var6;
      _Var7 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68);
      if (_Var6 < _Var7) {
        unique_ptr<duckdb::IEJoinUnion,std::default_delete<duckdb::IEJoinUnion>,true>::
        unique_ptr<std::default_delete<duckdb::IEJoinUnion>,void>
                  ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                    *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::operator=
                  ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                    *)in_stack_ffffffffffffff60,
                   (unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                    *)in_stack_ffffffffffffff58);
        unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                    *)0x181d983);
        *(__int_type *)(in_RDX + 0x20) = _Var5;
        pvVar4 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff60,
                            (size_type)in_stack_ffffffffffffff58);
        *(value_type *)(in_RDX + 0x18) = *pvVar4;
        pbVar8 = ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::get
                           ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                            in_stack_ffffffffffffff60);
        *(pointer *)(in_RDX + 0x1b0) = pbVar8 + *(long *)(in_RDX + 0x18);
        *(undefined8 *)(in_RDX + 0x1a0) = 0;
        iVar1 = PhysicalRangeJoin::GlobalSortedTable::BlockSize
                          (in_stack_ffffffffffffff60,(idx_t)in_stack_ffffffffffffff58);
        *(idx_t *)(in_RDX + 0x1a8) = iVar1;
      }
      else {
        *(undefined8 *)(in_RDX + 0x1b0) = 0;
        this_00 = (__atomic_base<unsigned_long> *)
                  ::std::__atomic_base<unsigned_long>::operator++
                            ((__atomic_base<unsigned_long> *)(in_RDI + 0xc0),0);
        p_Var11 = this_00;
        p_Var9 = (__atomic_base<unsigned_long> *)
                 ::std::__atomic_base::operator_cast_to_unsigned_long(this_00);
        if (this_00 < p_Var9) {
          unique_ptr<duckdb::IEJoinUnion,std::default_delete<duckdb::IEJoinUnion>,true>::
          unique_ptr<std::default_delete<duckdb::IEJoinUnion>,void>
                    ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                      *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::operator=
                    ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                      *)in_stack_ffffffffffffff60,
                     (unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                      *)in_stack_ffffffffffffff58);
          unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::
          ~unique_ptr((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                       *)0x181daa9);
          *(__atomic_base<unsigned_long> **)(in_RDX + 0x30) = p_Var11;
          pvVar4 = vector<unsigned_long,_true>::operator[]
                             ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff60,
                              (size_type)in_stack_ffffffffffffff58);
          *(value_type *)(in_RDX + 0x28) = *pvVar4;
          pbVar8 = ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::get
                             ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                              in_stack_ffffffffffffff60);
          *(pointer *)(in_RDX + 0x1b8) = pbVar8 + *(long *)(in_RDX + 0x28);
          *(undefined8 *)(in_RDX + 0x1a0) = 0;
          iVar1 = PhysicalRangeJoin::GlobalSortedTable::BlockSize
                            (in_stack_ffffffffffffff60,(idx_t)in_stack_ffffffffffffff58);
          *(idx_t *)(in_RDX + 0x1a8) = iVar1;
        }
        else {
          *(undefined8 *)(in_RDX + 0x1b8) = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void GetNextPair(ClientContext &client, IEJoinLocalSourceState &lstate) {
		auto &left_table = *gsink.tables[0];
		auto &right_table = *gsink.tables[1];

		const auto left_blocks = left_table.BlockCount();
		const auto right_blocks = right_table.BlockCount();
		const auto pair_count = left_blocks * right_blocks;

		// Regular block
		const auto i = next_pair++;
		if (i < pair_count) {
			const auto b1 = i / right_blocks;
			const auto b2 = i % right_blocks;

			lstate.left_block_index = b1;
			lstate.left_base = left_bases[b1];

			lstate.right_block_index = b2;
			lstate.right_base = right_bases[b2];

			lstate.joiner = make_uniq<IEJoinUnion>(client, op, left_table, b1, right_table, b2);
			return;
		}

		// Outer joins
		if (!left_outers && !right_outers) {
			return;
		}

		// Spin wait for regular blocks to finish(!)
		while (completed < pair_count) {
			std::this_thread::yield();
		}

		// Left outer blocks
		const auto l = next_left++;
		if (l < left_outers) {
			lstate.joiner = nullptr;
			lstate.left_block_index = l;
			lstate.left_base = left_bases[l];

			lstate.left_matches = left_table.found_match.get() + lstate.left_base;
			lstate.outer_idx = 0;
			lstate.outer_count = left_table.BlockSize(l);
			return;
		} else {
			lstate.left_matches = nullptr;
		}

		// Right outer block
		const auto r = next_right++;
		if (r < right_outers) {
			lstate.joiner = nullptr;
			lstate.right_block_index = r;
			lstate.right_base = right_bases[r];

			lstate.right_matches = right_table.found_match.get() + lstate.right_base;
			lstate.outer_idx = 0;
			lstate.outer_count = right_table.BlockSize(r);
			return;
		} else {
			lstate.right_matches = nullptr;
		}
	}